

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

bool __thiscall Moves::TryAttack(Moves *this,Move *m,Board *board,int id,int jd)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Piece *pPVar7;
  Square local_90;
  Square local_88;
  Square local_80;
  Square local_78;
  Square local_70;
  Square local_68;
  Square local_60;
  undefined1 local_58 [8];
  Move myMove;
  int jd_local;
  int id_local;
  Board *board_local;
  Move *m_local;
  Moves *this_local;
  
  myMove.m_PromoteTo._0_4_ = jd;
  myMove.m_PromoteTo._4_4_ = id;
  memcpy(local_58,m,0x28);
  iVar1 = myMove.m_PromoteTo._4_4_;
  local_68 = Move::Source((Move *)local_58);
  iVar3 = Square::I(&local_68);
  iVar6 = (int)myMove.m_PromoteTo;
  local_70 = Move::Source((Move *)local_58);
  iVar4 = Square::J(&local_70);
  Square::Square(&local_60,iVar1 + iVar3,iVar6 + iVar4);
  Move::Dest((Move *)local_58,&local_60);
  local_78 = Move::Dest((Move *)local_58);
  bVar2 = Square::IsOnBoard(&local_78);
  if (bVar2) {
    pPVar7 = Move::GetPiece((Move *)local_58);
    local_80 = Move::Dest((Move *)local_58);
    uVar5 = (*pPVar7->_vptr_Piece[4])(pPVar7,&local_80,board);
    if ((uVar5 & 1) != 0) {
      local_88 = Move::Dest((Move *)local_58);
      pPVar7 = BoardBase::Get((BoardBase *)board,&local_88);
      iVar6 = (**pPVar7->_vptr_Piece)();
      Move::Score((Move *)local_58,iVar6);
      Add(this,(Move *)local_58);
      return true;
    }
    local_90 = Move::Dest((Move *)local_58);
    bVar2 = BoardBase::IsEmpty((BoardBase *)board,&local_90);
    if (bVar2) {
      iVar6 = NoPiece::PieceValue(&None);
      Move::Score((Move *)local_58,iVar6);
      Add(this,(Move *)local_58);
      return true;
    }
  }
  return false;
}

Assistant:

bool TryAttack( const Move &m, const Board &board, int id, int jd )
    {
        Move myMove = m;

        myMove.Dest( Square( id + myMove.Source().I(), jd + myMove.Source().J() ) );

        if ( myMove.Dest().IsOnBoard() )
        {
            // Captures are more interesting than moves.
            if ( myMove.GetPiece()->IsDifferent( myMove.Dest(), board ) )
            {
                myMove.Score( board.Get( myMove.Dest() )->PieceValue() );
                Add( myMove );
                return true;
            }
            else if ( board.IsEmpty( myMove.Dest() ) )
            {
                myMove.Score( None.PieceValue() );
                Add( myMove );
                return true;
            }
        }

        return false;
    }